

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_EnvelopePhase5(opm_t *chip)

{
  uint16_t uVar1;
  ushort uVar2;
  uint uVar3;
  ushort local_1c;
  uint32_t step;
  uint32_t level;
  uint32_t slot;
  opm_t *chip_local;
  
  uVar3 = chip->cycles + 0x1d & 0x1f;
  uVar1 = chip->eg_level[uVar3];
  local_1c = 0;
  uVar2 = local_1c;
  local_1c = 0;
  if (chip->eg_instantattack != '\0') {
    uVar1 = 0;
  }
  if ((chip->eg_mute != '\0') || (chip->ic != '\0')) {
    uVar1 = 0x3ff;
  }
  if (chip->eg_inc != '\0') {
    local_1c = uVar2;
    if (chip->eg_inclinear != '\0') {
      local_1c = (ushort)(1 << (chip->eg_inc - 1 & 0x1f));
    }
    if (chip->eg_incattack != '\0') {
      local_1c = (ushort)((int)((chip->eg_level[uVar3] ^ 0xffffffff) << (chip->eg_inc & 0x1f)) >> 5)
                 | local_1c;
    }
  }
  chip->eg_level[uVar3] = local_1c + uVar1;
  chip->eg_out[0] = chip->eg_outtemp[1] + (ushort)chip->eg_tl[2] * 8;
  if ((chip->eg_out[0] & 0x400) != 0) {
    chip->eg_out[0] = 0x3ff;
  }
  if (chip->eg_test != '\0') {
    chip->eg_out[0] = 0;
  }
  chip->eg_test = chip->mode_test[5];
  return;
}

Assistant:

static void OPM_EnvelopePhase5(opm_t *chip)
{
    uint32_t slot = (chip->cycles + 29) % 32;
    uint32_t level = chip->eg_level[slot];
    uint32_t step = 0;
    if (chip->eg_instantattack)
    {
        level = 0;
    }
    if (chip->eg_mute || chip->ic)
    {
        level = 0x3ff;
    }
    if (chip->eg_inc)
    {
        if (chip->eg_inclinear)
        {
            step |= 1 << (chip->eg_inc - 1);
        }
        if (chip->eg_incattack)
        {
            step |= ((~(int32_t)chip->eg_level[slot]) << chip->eg_inc) >> 5;
        }
    }
    level += step;
    chip->eg_level[slot] = (uint16_t)level;

    chip->eg_out[0] = chip->eg_outtemp[1] + (chip->eg_tl[2] << 3);
    if (chip->eg_out[0] & 1024)
    {
        chip->eg_out[0] = 1023;
    }

    if (chip->eg_test)
    {
        chip->eg_out[0] = 0;
    }

    chip->eg_test = chip->mode_test[5];
}